

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::create_pipeline(ConvolutionDepthWise_x86_fma *this,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar8;
  int *piVar5;
  void *pvVar6;
  Allocator *pAVar7;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  Layer *pLVar12;
  int iVar13;
  undefined1 auVar14 [16];
  ParamDict pd;
  Mat local_68;
  
  if ((this->super_ConvolutionDepthWise).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_ConvolutionDepthWise).activation_type) {
  case 1:
    pLVar12 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_68);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_68);
    break;
  case 2:
    pLVar12 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_68);
    ParamDict::set((ParamDict *)&local_68,0,
                   *(this->super_ConvolutionDepthWise).activation_params.data);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_68);
    break;
  case 3:
    pLVar12 = create_layer_cpu(0x36);
    ParamDict::ParamDict((ParamDict *)&local_68);
    ParamDict::set((ParamDict *)&local_68,0,
                   *(this->super_ConvolutionDepthWise).activation_params.data);
    ParamDict::set((ParamDict *)&local_68,1,
                   *(float *)((long)(this->super_ConvolutionDepthWise).activation_params.data + 4));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_68);
    break;
  case 4:
    pLVar12 = create_layer_cpu(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_68);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_68);
    break;
  case 5:
    pLVar12 = create_layer_cpu(0x47);
    ParamDict::ParamDict((ParamDict *)&local_68);
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_68);
    break;
  case 6:
    pLVar12 = create_layer_cpu(0x43);
    ParamDict::ParamDict((ParamDict *)&local_68);
    ParamDict::set((ParamDict *)&local_68,0,
                   *(this->super_ConvolutionDepthWise).activation_params.data);
    ParamDict::set((ParamDict *)&local_68,1,
                   *(float *)((long)(this->super_ConvolutionDepthWise).activation_params.data + 4));
    (*pLVar12->_vptr_Layer[2])(pLVar12,&local_68);
    break;
  default:
    pLVar12 = (Layer *)0x0;
    goto LAB_00406c2a;
  }
  ParamDict::~ParamDict((ParamDict *)&local_68);
  (*pLVar12->_vptr_Layer[4])(pLVar12,opt);
LAB_00406c2a:
  this->activation = pLVar12;
  if ((opt->use_int8_inference == true) &&
     ((this->super_ConvolutionDepthWise).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar4 = (this->super_ConvolutionDepthWise).kernel_w;
  uVar8 = (this->super_ConvolutionDepthWise).kernel_h;
  auVar14._4_4_ = uVar8;
  auVar14._0_4_ = uVar4;
  iVar13 = uVar8 * uVar4;
  uVar11 = (this->super_ConvolutionDepthWise).group;
  uVar9 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)(int)uVar11;
  uVar9 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) / (long)iVar13;
  uVar2 = (this->super_ConvolutionDepthWise).num_output;
  if ((uVar11 == uVar2) &&
     ((int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
           (long)((int)uVar2 / (int)uVar11)) * uVar11 == uVar11)) {
    if (opt->use_packing_layout == true) {
      if ((uVar11 & 7) == 0) {
        Mat::reshape(&local_68,&(this->super_ConvolutionDepthWise).weight_data,iVar13,uVar11,
                     (Allocator *)0x0);
        convert_packing(&local_68,&this->weight_data_tm,8,opt);
        if (local_68.refcount == (int *)0x0) goto LAB_00406e9f;
        LOCK();
        *local_68.refcount = *local_68.refcount + -1;
        UNLOCK();
        if (*local_68.refcount != 0) goto LAB_00406e9f;
        if (local_68.allocator != (Allocator *)0x0) {
          (*(local_68.allocator)->_vptr_Allocator[3])();
          goto LAB_00406e9f;
        }
      }
      else {
        if ((uVar11 & 3) != 0) goto LAB_00406cb9;
        Mat::reshape(&local_68,&(this->super_ConvolutionDepthWise).weight_data,iVar13,uVar11,
                     (Allocator *)0x0);
        convert_packing(&local_68,&this->weight_data_tm,4,opt);
        if (local_68.refcount == (int *)0x0) goto LAB_00406e9f;
        LOCK();
        *local_68.refcount = *local_68.refcount + -1;
        UNLOCK();
        if (*local_68.refcount != 0) goto LAB_00406e9f;
        if (local_68.allocator != (Allocator *)0x0) {
          (*(local_68.allocator)->_vptr_Allocator[3])();
          goto LAB_00406e9f;
        }
      }
      if (local_68.data != (void *)0x0) {
        free(local_68.data);
      }
      goto LAB_00406e9f;
    }
LAB_00406cb9:
    auVar1._0_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar1._4_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar1._8_4_ = (this->super_ConvolutionDepthWise).stride_w;
    auVar1._12_4_ = (this->super_ConvolutionDepthWise).stride_h;
    auVar14._8_8_ = 0;
    auVar14 = vpunpcklqdq_avx(auVar14,auVar1);
    auVar14 = vpcmpeqd_avx(auVar14,_DAT_005c3380);
    uVar11 = vmovmskps_avx(auVar14);
    iVar13 = (this->super_ConvolutionDepthWise).stride_w;
    iVar3 = (this->super_ConvolutionDepthWise).stride_h;
    if ((iVar3 == 1 && (iVar13 == 1 && (uVar11 ^ 0xf) == 0)) ||
       ((iVar3 == 2 && iVar13 == 2) && (char)(uVar11 ^ 0xf) == '\0')) {
      piVar5 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = (this->weight_data_tm).refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          pvVar6 = (this->weight_data_tm).data;
          pAVar7 = (this->weight_data_tm).allocator;
          if (pAVar7 == (Allocator *)0x0) {
            if (pvVar6 != (void *)0x0) {
              free(pvVar6);
            }
          }
          else {
            (*pAVar7->_vptr_Allocator[3])();
          }
        }
      }
      piVar5 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      (this->weight_data_tm).data = (this->super_ConvolutionDepthWise).weight_data.data;
      (this->weight_data_tm).refcount = piVar5;
      (this->weight_data_tm).elemsize = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      (this->weight_data_tm).elempack = (this->super_ConvolutionDepthWise).weight_data.elempack;
      (this->weight_data_tm).allocator = (this->super_ConvolutionDepthWise).weight_data.allocator;
      iVar13 = (this->super_ConvolutionDepthWise).weight_data.w;
      iVar3 = (this->super_ConvolutionDepthWise).weight_data.h;
      iVar10 = (this->super_ConvolutionDepthWise).weight_data.d;
      (this->weight_data_tm).dims = (this->super_ConvolutionDepthWise).weight_data.dims;
      (this->weight_data_tm).w = iVar13;
      (this->weight_data_tm).h = iVar3;
      (this->weight_data_tm).d = iVar10;
      (this->weight_data_tm).c = (this->super_ConvolutionDepthWise).weight_data.c;
      (this->weight_data_tm).cstep = (this->super_ConvolutionDepthWise).weight_data.cstep;
      goto LAB_00406e9f;
    }
  }
  create_group_ops(this,opt);
LAB_00406e9f:
  if (opt->lightmode == true) {
    piVar5 = (this->super_ConvolutionDepthWise).weight_data.refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        pvVar6 = (this->super_ConvolutionDepthWise).weight_data.data;
        pAVar7 = (this->super_ConvolutionDepthWise).weight_data.allocator;
        if (pAVar7 == (Allocator *)0x0) {
          if (pvVar6 != (void *)0x0) {
            free(pvVar6);
          }
        }
        else {
          (*pAVar7->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_ConvolutionDepthWise).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_ConvolutionDepthWise).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_ConvolutionDepthWise).weight_data.elemsize + 4) = 0;
    (this->super_ConvolutionDepthWise).weight_data.data = (void *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.refcount = (int *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.dims = 0;
    (this->super_ConvolutionDepthWise).weight_data.w = 0;
    (this->super_ConvolutionDepthWise).weight_data.h = 0;
    (this->super_ConvolutionDepthWise).weight_data.d = 0;
    (this->super_ConvolutionDepthWise).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                weight_data_tm = weight_data;
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                weight_data_tm = weight_data;
            }
            else
            {
                create_group_ops(opt);
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}